

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 GenStateEnterBlock(jx9_gen_state *pGen,sxi32 iType,sxu32 nFirstInstr,void *pUserData,
                        GenBlock **ppBlock)

{
  GenBlock *pBlock_00;
  GenBlock *pBlock;
  GenBlock **ppBlock_local;
  void *pUserData_local;
  sxu32 nFirstInstr_local;
  sxi32 iType_local;
  jx9_gen_state *pGen_local;
  
  pBlock_00 = (GenBlock *)SyMemBackendPoolAlloc(&pGen->pVm->sAllocator,0x78);
  if (pBlock_00 == (GenBlock *)0x0) {
    pGen_local._4_4_ = GenStateOutOfMem(pGen);
  }
  else {
    SyZero(pBlock_00,0x78);
    GenStateInitBlock(pGen,pBlock_00,iType,nFirstInstr,pUserData);
    pBlock_00->pParent = pGen->pCurrent;
    pGen->pCurrent = pBlock_00;
    if (ppBlock != (GenBlock **)0x0) {
      *ppBlock = pBlock_00;
    }
    pGen_local._4_4_ = 0;
  }
  return pGen_local._4_4_;
}

Assistant:

static sxi32 GenStateEnterBlock(
	jx9_gen_state *pGen,  /* Code generator state */
	sxi32 iType,          /* Block type [i.e: loop, conditional, function body, etc.]*/
	sxu32 nFirstInstr,    /* First instruction to compile */
	void *pUserData,      /* Upper layer private data */
	GenBlock **ppBlock    /* OUT: instantiated block */
	)
{
	GenBlock *pBlock;
	/* Allocate a new block instance */
	pBlock = (GenBlock *)SyMemBackendPoolAlloc(&pGen->pVm->sAllocator, sizeof(GenBlock));
	if( pBlock == 0 ){
		/* If the supplied memory subsystem is so sick that we are unable to allocate
		 * a tiny chunk of memory, there is no much we can do here.
		 */
		return GenStateOutOfMem(pGen);
	}
	/* Zero the structure */
	SyZero(pBlock, sizeof(GenBlock));
	GenStateInitBlock(&(*pGen), pBlock, iType, nFirstInstr, pUserData);
	/* Link to the parent block */
	pBlock->pParent = pGen->pCurrent;
	/* Mark as the current block */
	pGen->pCurrent = pBlock;
	if( ppBlock ){
		/* Write a pointer to the new instance */
		*ppBlock = pBlock;
	}
	return SXRET_OK;
}